

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void MemberExpression_dot_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  undefined1 local_70 [8];
  JsValue r1;
  JsValue r2;
  JsValue r5;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_70);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_70,res_00);
  JsToObject(res_00,(JsValue *)((long)&r2.u + 8));
  res->type = JS_REFERENCE;
  (res->u).number = (double)r5._0_8_;
  (res->u).reference.name = (char *)na[1].location;
  return;
}

Assistant:

static void
MemberExpression_dot_eval(na, context, res)
	struct JsAstNode *na; /* (struct MemberExpression_dot_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstMemberExpressionDotNode *n = 
		CAST_NODE(na, JsAstMemberExpressionDotNode);
	struct JsValue r1, r2, r5;

	EVAL(n->mexp, context, &r1);
	JsGetValue( &r1, &r2);
	JsToObject(&r2, &r5);
	res->type = JS_REFERENCE;
	res->u.reference.base = r5.u.object;
	res->u.reference.name = n->name;

}